

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSuspend(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name tag)

{
  Tag *pTVar1;
  size_t size;
  Suspend *expr;
  Signature SVar2;
  Iterator __first;
  Iterator __last;
  Expression local_c0;
  size_t sStack_b0;
  char *local_a8;
  ArenaVector<wasm::Expression_*> AStack_a0;
  string local_80 [32];
  undefined1 local_60 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  __index_type local_40;
  
  local_a8 = tag.super_IString.str._M_str;
  sStack_b0 = tag.super_IString.str._M_len;
  AStack_a0.allocator = &this->wasm->allocator;
  local_c0._id = SuspendId;
  local_c0.type.id = 0;
  AStack_a0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  AStack_a0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
       = 0;
  AStack_a0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  pTVar1 = Module::getTag(this->wasm,tag);
  SVar2 = HeapType::getSignature(&pTVar1->type);
  local_60 = (undefined1  [8])SVar2.params.id;
  size = wasm::Type::size((Type *)local_60);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            (&AStack_a0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             size);
  visitExpression((Result<wasm::Ok> *)local_60,this,&local_c0);
  if (local_40 == '\x01') {
    std::__cxx11::string::string(local_80,(string *)local_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    __first.index = 0;
    __first.parent = &AStack_a0;
    __last.index = AStack_a0.
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
    __last.parent = &AStack_a0;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_60,__first,
               __last,(allocator_type *)local_80);
    expr = Builder::makeSuspend
                     (&this->builder,tag,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60);
    push(this,(Expression *)expr);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSuspend(Name tag) {
  Suspend curr(wasm.allocator);
  curr.tag = tag;
  curr.operands.resize(wasm.getTag(tag)->params().size());
  CHECK_ERR(visitSuspend(&curr));

  std::vector<Expression*> operands(curr.operands.begin(), curr.operands.end());
  push(builder.makeSuspend(tag, operands));
  return Ok{};
}